

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolutiondepthwise.cpp
# Opt level: O1

int __thiscall
ncnn::DeconvolutionDepthWise::forward
          (DeconvolutionDepthWise *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float *pfVar1;
  float fVar2;
  int *piVar3;
  Allocator *pAVar4;
  size_t sVar5;
  size_t sVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  DeconvolutionDepthWise *pDVar11;
  undefined4 uVar12;
  Option *opt_00;
  pointer piVar13;
  int iVar14;
  uint uVar15;
  int iVar16;
  Mat *pMVar17;
  int iVar18;
  int iVar19;
  ulong uVar20;
  int iVar21;
  size_t __size;
  long lVar22;
  void *pvVar23;
  int iVar24;
  void *pvVar25;
  long lVar26;
  long lVar27;
  int iVar28;
  Mat *pMVar29;
  ulong uVar30;
  int size_1;
  int iVar31;
  int iVar32;
  long lVar33;
  void *pvVar34;
  size_type __n;
  ulong uVar35;
  uint uVar36;
  bool bVar37;
  uint uVar38;
  undefined4 uVar39;
  float fVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  Mat local_248;
  DeconvolutionDepthWise *local_208;
  Mat *local_200;
  void *local_1f8;
  int size_3;
  Mat *local_1e8;
  Mat *local_1e0;
  long local_1d8;
  uint local_1cc;
  Mat local_1c8;
  int remain_1;
  void *local_178;
  ulong local_170;
  ulong local_168;
  long local_160;
  int remain;
  ulong local_150;
  Mat *local_148;
  Mat *local_140;
  ulong local_138;
  void *local_130;
  ulong local_128;
  Mat *local_120;
  void *local_118;
  int local_10c;
  int local_108;
  int local_104;
  Option *local_100;
  Mat *local_f8;
  void *local_f0;
  long local_e8;
  float *local_e0;
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  long local_b0;
  void *local_a8;
  Mat *local_a0;
  Mat *local_98;
  void *local_90;
  void *local_88;
  ulong local_80;
  long local_78;
  vector<int,_std::allocator<int>_> _space_ofs;
  Option opt_b;
  
  iVar16 = bottom_blob->c;
  if (iVar16 % this->group != 0) {
    return -100;
  }
  iVar32 = this->num_output;
  if (iVar32 % this->group != 0) {
    return -100;
  }
  local_1d8 = (long)bottom_blob->w;
  local_148 = (Mat *)(ulong)(uint)bottom_blob->h;
  pMVar17 = (Mat *)bottom_blob->elemsize;
  iVar18 = (this->kernel_h + -1) * this->dilation_h;
  iVar31 = (this->kernel_w + -1) * this->dilation_w + (bottom_blob->w + -1) * this->stride_w + 1;
  iVar14 = (bottom_blob->h - 1U) * this->stride_h;
  iVar28 = iVar18 + iVar14 + 1;
  local_248.elemsize = 0;
  local_248.elempack = 0;
  local_248.data = (void *)0x0;
  local_248.refcount._0_4_ = 0;
  local_248.refcount._4_4_ = 0;
  local_248.allocator = (Allocator *)0x0;
  local_248.dims = 0;
  local_248.w = 0;
  local_248.h = 0;
  local_248.c = 0;
  local_248.cstep = 0;
  auVar42._0_4_ = -(uint)(0 < this->pad_left);
  auVar42._4_4_ = -(uint)(0 < this->pad_right);
  auVar42._8_4_ = -(uint)(0 < this->pad_top);
  auVar42._12_4_ = -(uint)(0 < this->pad_bottom);
  iVar14 = movmskps(iVar14,auVar42);
  local_208 = this;
  local_1e8 = bottom_blob;
  local_f8 = top_blob;
  if ((((iVar14 == 0) && (this->output_pad_right < 1)) && (this->output_pad_bottom < 1)) &&
     ((this->output_w < 1 || (this->output_h < 1)))) {
    if (&local_248 != top_blob) {
      piVar3 = top_blob->refcount;
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + 1;
        UNLOCK();
      }
      local_248.data = top_blob->data;
      local_248.refcount._0_4_ = SUB84(top_blob->refcount,0);
      local_248.refcount._4_4_ = (undefined4)((ulong)top_blob->refcount >> 0x20);
      local_248.elemsize = top_blob->elemsize;
      local_248.elempack = top_blob->elempack;
      local_248.allocator = top_blob->allocator;
      uVar7 = top_blob->dims;
      uVar8 = top_blob->w;
      uVar9 = top_blob->h;
      uVar10 = top_blob->c;
      local_248.cstep = top_blob->cstep;
      local_248.dims = uVar7;
      local_248.w = uVar8;
      local_248.h = uVar9;
      local_248.c = uVar10;
    }
    iVar32 = this->num_output;
    pAVar4 = opt->blob_allocator;
    auVar45._0_4_ = -(uint)(local_248.dims == 3);
    auVar45._4_4_ = -(uint)(iVar31 == local_248.w);
    auVar45._8_4_ = -(uint)(iVar28 == local_248.h);
    auVar45._12_4_ = -(uint)(iVar32 == local_248.c);
    iVar14 = movmskps(iVar18,auVar45);
    if (((iVar14 != 0xf) || (local_248.elempack != 1)) ||
       ((local_248.allocator != pAVar4 || ((Mat *)local_248.elemsize != pMVar17)))) {
      piVar3 = (int *)CONCAT44(local_248.refcount._4_4_,local_248.refcount._0_4_);
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          if (local_248.allocator == (Allocator *)0x0) {
            if (local_248.data != (void *)0x0) {
              free(local_248.data);
            }
          }
          else {
            (**(code **)(*(long *)local_248.allocator + 0x18))();
          }
        }
      }
      local_248.data = (void *)0x0;
      local_248.refcount._0_4_ = 0;
      local_248.refcount._4_4_ = 0;
      local_248.refcount = (int *)0x0;
      local_248.elempack = 1;
      local_248.dims = 3;
      local_248.cstep =
           ((long)(iVar28 * iVar31) * (long)pMVar17 + 0xfU & 0xfffffffffffffff0) / (ulong)pMVar17;
      local_248.elemsize = (size_t)pMVar17;
      local_248.allocator = pAVar4;
      local_248.w = iVar31;
      local_248.h = iVar28;
      local_248.c = iVar32;
      if ((long)iVar32 * local_248.cstep != 0) {
        uVar35 = (long)iVar32 * local_248.cstep * (long)pMVar17 + 3 & 0xfffffffffffffffc;
        __size = uVar35 + 4;
        if (pAVar4 == (Allocator *)0x0) goto LAB_001666a9;
        local_248.data = (void *)(**(code **)(*(long *)pAVar4 + 0x10))(pAVar4,__size);
        goto LAB_001666e2;
      }
    }
  }
  else {
    local_248.allocator = opt->workspace_allocator;
    auVar48._4_4_ = -(uint)(iVar28 == 0);
    auVar48._0_4_ = -(uint)(iVar31 == 0);
    auVar48._8_4_ = -(uint)(iVar32 == 0);
    auVar48._12_4_ = 0;
    movmskps(iVar18,auVar48 << 0x20);
    local_248.data = (void *)0x0;
    local_248.refcount._0_4_ = 0;
    local_248.refcount._4_4_ = 0;
    local_248.refcount = (int *)0x0;
    local_248.elempack = 1;
    local_248.dims = 3;
    local_248.cstep =
         ((long)(iVar28 * iVar31) * (long)pMVar17 + 0xfU & 0xfffffffffffffff0) / (ulong)pMVar17;
    local_248.elemsize = (size_t)pMVar17;
    local_248.w = iVar31;
    local_248.h = iVar28;
    local_248.c = iVar32;
    if ((long)iVar32 * local_248.cstep != 0) {
      uVar35 = (long)iVar32 * local_248.cstep * (long)pMVar17 + 3 & 0xfffffffffffffffc;
      __size = uVar35 + 4;
      if (local_248.allocator == (Allocator *)0x0) {
LAB_001666a9:
        local_248.dims = 3;
        local_248.elempack = 1;
        local_248.refcount._4_4_ = 0;
        local_248.refcount._0_4_ = 0;
        local_248.data = (void *)0x0;
        local_1c8.data = (void *)0x0;
        local_248.elemsize = (size_t)pMVar17;
        local_248.w = iVar31;
        local_248.h = iVar28;
        iVar32 = posix_memalign(&local_1c8.data,0x10,__size);
        local_248.data = local_1c8.data;
        if (iVar32 != 0) {
          local_1c8.data = (void *)0x0;
          local_248.data = local_1c8.data;
        }
      }
      else {
        local_248.data =
             (void *)(**(code **)(*(long *)local_248.allocator + 0x10))(local_248.allocator,__size);
      }
LAB_001666e2:
      local_248.refcount = (int *)(uVar35 + (long)local_248.data);
      *local_248.refcount = 1;
    }
  }
  pDVar11 = local_208;
  iVar32 = -100;
  local_1c8.refcount = (int *)CONCAT44(local_1c8.refcount._4_4_,local_1c8.refcount._0_4_);
  if ((local_248.data == (void *)0x0) ||
     (local_1c8.refcount = (int *)CONCAT44(local_1c8.refcount._4_4_,local_1c8.refcount._0_4_),
     (long)local_248.c * local_248.cstep == 0)) goto LAB_00167708;
  uVar36 = local_208->kernel_w * local_208->kernel_h;
  __n = (size_type)(int)uVar36;
  local_100 = opt;
  std::vector<int,_std::allocator<int>_>::vector(&_space_ofs,__n,(allocator_type *)&local_1c8);
  piVar13 = _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_start;
  if (0 < pDVar11->kernel_h) {
    iVar32 = pDVar11->dilation_h;
    iVar14 = pDVar11->dilation_w;
    iVar18 = pDVar11->kernel_w;
    iVar19 = 0;
    iVar21 = 0;
    iVar24 = 0;
    do {
      if (0 < pDVar11->kernel_w) {
        lVar26 = 0;
        do {
          _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[iVar19 + lVar26] = iVar21;
          iVar21 = iVar21 + pDVar11->dilation_w;
          lVar26 = lVar26 + 1;
        } while ((int)lVar26 < pDVar11->kernel_w);
        iVar19 = iVar19 + (int)lVar26;
      }
      iVar21 = iVar21 + (iVar32 * iVar31 - iVar14 * iVar18);
      iVar24 = iVar24 + 1;
    } while (iVar24 < pDVar11->kernel_h);
  }
  iVar32 = pDVar11->group;
  if (iVar32 == pDVar11->num_output && iVar16 == iVar32) {
    local_120 = (Mat *)(long)pDVar11->group;
    pMVar17 = local_120;
    if (0 < (long)local_120) {
      local_d8._0_8_ = local_1e8->data;
      local_128 = local_1e8->cstep * local_1e8->elemsize;
      pvVar34 = (local_208->weight_data).data;
      local_1e0 = (Mat *)local_248.elemsize;
      local_1e8 = (Mat *)(local_248.cstep * local_248.elemsize);
      local_170 = CONCAT44(local_170._4_4_,local_248.w);
      _remain = (void *)(ulong)(uint)(local_248.h * local_248.w);
      local_160 = CONCAT44(local_160._4_4_,local_208->bias_term);
      local_130 = (local_208->bias_data).data;
      _size_3 = (Mat *)(ulong)(uint)(iVar28 * iVar31);
      _remain_1 = (float *)(local_208->activation_params).data;
      local_168 = (ulong)(local_248.h * local_248.w + 3U & 0xfffffffc);
      lVar26 = (long)_remain - 1;
      auVar47._8_4_ = (int)lVar26;
      auVar47._0_8_ = lVar26;
      auVar47._12_4_ = (int)((ulong)lVar26 >> 0x20);
      pvVar25 = (void *)((long)local_248.data + 0xc);
      auVar47 = auVar47 ^ _DAT_00171020;
      local_150 = (ulong)(local_208->activation_type - 1);
      pMVar29 = (Mat *)0x0;
      local_178 = local_248.data;
      pvVar23 = local_248.data;
      auVar45 = _DAT_001720f0;
      auVar42 = _DAT_00171010;
      auVar48 = _DAT_00171020;
      local_c8 = auVar47;
      do {
        uVar39 = 0;
        if ((int)local_160 != 0) {
          uVar39 = *(undefined4 *)((long)local_130 + (long)pMVar29 * 4);
        }
        if (0 < remain) {
          uVar35 = 0;
          do {
            auVar43._8_4_ = (int)uVar35;
            auVar43._0_8_ = uVar35;
            auVar43._12_4_ = (int)(uVar35 >> 0x20);
            auVar46 = (auVar43 | auVar42) ^ auVar48;
            iVar16 = auVar47._4_4_;
            if ((bool)(~(iVar16 < auVar46._4_4_ ||
                        auVar47._0_4_ < auVar46._0_4_ && auVar46._4_4_ == iVar16) & 1)) {
              *(undefined4 *)((long)pvVar25 + uVar35 * 4 + -0xc) = uVar39;
            }
            if (auVar46._12_4_ <= auVar47._12_4_ &&
                (auVar46._8_4_ <= auVar47._8_4_ || auVar46._12_4_ != auVar47._12_4_)) {
              *(undefined4 *)((long)pvVar25 + uVar35 * 4 + -8) = uVar39;
            }
            auVar46 = (auVar43 | auVar45) ^ auVar48;
            iVar32 = auVar46._4_4_;
            if (iVar32 <= iVar16 && (iVar32 != iVar16 || auVar46._0_4_ <= auVar47._0_4_)) {
              *(undefined4 *)((long)pvVar25 + uVar35 * 4 + -4) = uVar39;
              *(undefined4 *)((long)pvVar25 + uVar35 * 4) = uVar39;
            }
            uVar35 = uVar35 + 4;
          } while (local_168 != uVar35);
        }
        if (0 < (int)local_148) {
          iVar16 = local_208->stride_h;
          iVar32 = local_208->stride_w;
          pMVar17 = (Mat *)0x0;
          do {
            if (0 < (int)local_1d8) {
              lVar26 = 0;
              do {
                if (0 < (int)uVar36) {
                  lVar33 = lVar26 * iVar32 * 4 +
                           (long)(int)(iVar16 * (uint)local_170 * (int)pMVar17) * (long)local_1e0 +
                           (long)local_1e8 * (long)pMVar29;
                  uVar35 = 0;
                  do {
                    lVar22 = (long)piVar13[uVar35];
                    *(float *)((long)local_178 + lVar22 * 4 + lVar33) =
                         *(float *)((long)pvVar34 + uVar35 * 4) *
                         *(float *)(local_128 * (long)pMVar29 + local_d8._0_8_ +
                                    (long)pMVar17 * local_1d8 * 4 + lVar26 * 4) +
                         *(float *)((long)local_178 + lVar22 * 4 + lVar33);
                    uVar35 = uVar35 + 1;
                  } while (uVar36 != uVar35);
                }
                lVar26 = lVar26 + 1;
              } while (lVar26 != local_1d8);
            }
            pMVar17 = (Mat *)((long)&pMVar17->data + 1);
          } while (pMVar17 != local_148);
        }
        local_200 = pMVar29;
        local_1f8 = pvVar23;
        local_118 = pvVar25;
        if ((uint)local_150 < 4) {
          iVar16 = (int)_size_3;
          switch((long)&switchD_00166b07::switchdataD_00172744 +
                 (long)(int)(&switchD_00166b07::switchdataD_00172744)[local_150]) {
          case 0x166b09:
            if (0 < iVar16) {
              pMVar17 = (Mat *)0x0;
              do {
                fVar40 = *(float *)((long)pvVar23 + (long)pMVar17 * 4);
                if (fVar40 <= 0.0) {
                  fVar40 = 0.0;
                }
                *(float *)((long)pvVar23 + (long)pMVar17 * 4) = fVar40;
                pMVar17 = (Mat *)((long)&pMVar17->data + 1);
              } while (_size_3 != pMVar17);
            }
            break;
          case 0x166b33:
            if (0 < iVar16) {
              fVar40 = *_remain_1;
              fVar2 = _remain_1[1];
              pMVar17 = (Mat *)0x0;
              do {
                pfVar1 = (float *)((long)pvVar23 + (long)pMVar17 * 4);
                if (*pfVar1 <= fVar40 && fVar40 != *pfVar1) {
                  *(float *)((long)pvVar23 + (long)pMVar17 * 4) = fVar40;
                }
                if (fVar2 < *(float *)((long)pvVar23 + (long)pMVar17 * 4)) {
                  *(float *)((long)pvVar23 + (long)pMVar17 * 4) = fVar2;
                }
                pMVar17 = (Mat *)((long)&pMVar17->data + 1);
              } while (_size_3 != pMVar17);
            }
            break;
          case 0x166b72:
            if (0 < iVar16) {
              fVar40 = *_remain_1;
              pMVar17 = (Mat *)0x0;
              do {
                fVar2 = *(float *)((long)pvVar23 + (long)pMVar17 * 4);
                uVar15 = -(uint)(0.0 < fVar2);
                *(float *)((long)pvVar23 + (long)pMVar17 * 4) =
                     (float)(~uVar15 & (uint)fVar40 | uVar15 & 0x3f800000) * fVar2;
                pMVar17 = (Mat *)((long)&pMVar17->data + 1);
              } while (_size_3 != pMVar17);
            }
            break;
          case 0x166bbd:
            if (0 < iVar16) {
              pMVar17 = (Mat *)0x0;
              do {
                fVar40 = expf((float)(*(uint *)((long)local_1f8 + (long)pMVar17 * 4) ^ auVar48._0_4_
                                     ));
                auVar45 = _DAT_001720f0;
                auVar48 = _DAT_00171020;
                auVar42 = _DAT_00171010;
                *(float *)((long)local_1f8 + (long)pMVar17 * 4) = 1.0 / (fVar40 + 1.0);
                pMVar17 = (Mat *)((long)&pMVar17->data + 1);
                auVar47 = local_c8;
              } while (_size_3 != pMVar17);
            }
          }
        }
        pMVar29 = (Mat *)((long)&local_200->data + 1);
        pvVar25 = (void *)((long)local_118 + (long)local_1e8);
        pvVar34 = (void *)((long)pvVar34 + __n * 4);
        pvVar23 = (void *)((long)local_1f8 + (long)local_1e8);
        pMVar17 = local_1e8;
      } while (pMVar29 != local_120);
    }
  }
  else {
    uVar15 = iVar16 / iVar32;
    local_1cc = pDVar11->num_output / iVar32;
    local_98 = (Mat *)(long)pDVar11->group;
    pMVar17 = local_98;
    if (0 < (long)local_98) {
      local_120 = (Mat *)local_248.elemsize;
      local_178 = (void *)(local_248.cstep * local_248.elemsize);
      local_108 = local_248.w;
      _remain_1 = (float *)(ulong)(uint)(local_248.h * local_248.w);
      local_a8 = (local_208->weight_data).data;
      local_104 = local_208->bias_term;
      _size_3 = (Mat *)(ulong)(uint)(iVar28 * iVar31);
      local_b0 = (long)(int)local_1cc;
      local_80 = (ulong)local_1cc;
      uVar35 = (ulong)(local_248.h * local_248.w + 3U & 0xfffffffc);
      lVar26 = (long)_remain_1 + -1;
      auVar46._8_4_ = (int)lVar26;
      auVar46._0_8_ = lVar26;
      auVar46._12_4_ = (int)((ulong)lVar26 >> 0x20);
      local_a0 = (Mat *)((long)local_178 * local_b0);
      local_10c = uVar15 * uVar36 * local_1cc;
      local_78 = (long)(int)(uVar15 * uVar36) << 2;
      auVar46 = auVar46 ^ _DAT_00171020;
      local_170 = (ulong)(local_208->activation_type - 1);
      local_e8 = (long)local_248.data + 0xc;
      local_138 = 0;
      local_90 = local_248.data;
      local_f0 = local_248.data;
      local_140 = (Mat *)0x0;
      auVar45 = _DAT_001720f0;
      auVar42 = _DAT_00171010;
      auVar48 = _DAT_00171020;
      local_168 = uVar35;
      local_d8 = auVar46;
      do {
        if (0 < (int)local_1cc) {
          local_1f8 = (void *)((long)local_a8 + (long)(int)local_138 * 4);
          local_130 = (void *)((long)local_140 * local_b0);
          local_e0 = (float *)(local_208->activation_params).data;
          local_88 = (local_208->bias_data).data;
          iVar16 = (int)local_140;
          uVar30 = 0;
          pvVar25 = local_f0;
          lVar26 = local_e8;
          do {
            if (local_104 == 0) {
              uVar39 = 0;
            }
            else {
              uVar39 = *(undefined4 *)((long)local_88 + (uVar30 + (long)local_130) * 4);
            }
            if (0 < remain_1) {
              uVar20 = 0;
              do {
                auVar44._8_4_ = (int)uVar20;
                auVar44._0_8_ = uVar20;
                auVar44._12_4_ = (int)(uVar20 >> 0x20);
                auVar47 = (auVar44 | auVar42) ^ auVar48;
                iVar32 = auVar46._4_4_;
                if ((bool)(~(iVar32 < auVar47._4_4_ ||
                            auVar46._0_4_ < auVar47._0_4_ && auVar47._4_4_ == iVar32) & 1)) {
                  *(undefined4 *)(lVar26 + -0xc + uVar20 * 4) = uVar39;
                }
                if (auVar47._12_4_ <= auVar46._12_4_ &&
                    (auVar47._8_4_ <= auVar46._8_4_ || auVar47._12_4_ != auVar46._12_4_)) {
                  *(undefined4 *)(lVar26 + -8 + uVar20 * 4) = uVar39;
                }
                auVar44 = (auVar44 | auVar45) ^ auVar48;
                iVar14 = auVar44._4_4_;
                if (iVar14 <= iVar32 && (iVar14 != iVar32 || auVar44._0_4_ <= auVar46._0_4_)) {
                  *(undefined4 *)(lVar26 + -4 + uVar20 * 4) = uVar39;
                  *(undefined4 *)(lVar26 + uVar20 * 4) = uVar39;
                }
                uVar20 = uVar20 + 4;
              } while (uVar35 != uVar20);
            }
            if (0 < (int)local_148) {
              local_118 = (void *)((uVar30 + (long)local_130) * (long)local_178 + (long)local_90);
              iVar14 = local_208->stride_h * local_108;
              local_150 = CONCAT44(local_150._4_4_,iVar14);
              iVar32 = local_208->stride_w;
              local_c8._0_8_ = (long)iVar32;
              local_200 = (Mat *)0x0;
              do {
                if (0 < (int)local_1d8) {
                  local_1e0 = (Mat *)((long)(iVar14 * (int)local_200) * (long)local_120 +
                                     (long)local_118);
                  iVar18 = local_1e8->w;
                  sVar6 = local_1e8->elemsize;
                  sVar5 = local_1e8->cstep;
                  pvVar34 = local_1e8->data;
                  lVar33 = 0;
                  do {
                    if (0 < (int)uVar15) {
                      lVar22 = lVar33 * iVar32;
                      uVar35 = 0;
                      pvVar23 = local_1f8;
                      do {
                        if (0 < (int)uVar36) {
                          fVar40 = *(float *)((long)pvVar34 +
                                             (uVar35 + uVar15 * iVar16) * sVar5 * sVar6 +
                                             lVar33 * 4 + (long)iVar18 * (long)local_200 * sVar6);
                          uVar20 = 0;
                          do {
                            lVar27 = (long)piVar13[uVar20];
                            *(float *)((long)&local_1e0->data + lVar27 * 4 + lVar22 * 4) =
                                 *(float *)((long)pvVar23 + uVar20 * 4) * fVar40 +
                                 *(float *)((long)&local_1e0->data + lVar27 * 4 + lVar22 * 4);
                            uVar20 = uVar20 + 1;
                          } while (uVar36 != uVar20);
                        }
                        uVar35 = uVar35 + 1;
                        pvVar23 = (void *)((long)pvVar23 + __n * 4);
                      } while (uVar35 != uVar15);
                    }
                    lVar33 = lVar33 + 1;
                  } while (lVar33 != local_1d8);
                }
                local_200 = (Mat *)((long)&local_200->data + 1);
              } while (local_200 != local_148);
            }
            local_160 = lVar26;
            _remain = pvVar25;
            local_128 = uVar30;
            if ((uint)local_170 < 4) {
              iVar32 = (int)_size_3;
              switch((long)&switchD_001670da::switchdataD_00172734 +
                     (long)(int)(&switchD_001670da::switchdataD_00172734)[local_170]) {
              case 0x1670dc:
                if (0 < iVar32) {
                  pMVar17 = (Mat *)0x0;
                  do {
                    fVar40 = *(float *)((long)pvVar25 + (long)pMVar17 * 4);
                    if (fVar40 <= 0.0) {
                      fVar40 = 0.0;
                    }
                    *(float *)((long)pvVar25 + (long)pMVar17 * 4) = fVar40;
                    pMVar17 = (Mat *)((long)&pMVar17->data + 1);
                  } while (_size_3 != pMVar17);
                }
                break;
              case 0x167106:
                if (0 < iVar32) {
                  fVar40 = *local_e0;
                  fVar2 = local_e0[1];
                  pMVar17 = (Mat *)0x0;
                  do {
                    pfVar1 = (float *)((long)pvVar25 + (long)pMVar17 * 4);
                    if (*pfVar1 <= fVar40 && fVar40 != *pfVar1) {
                      *(float *)((long)pvVar25 + (long)pMVar17 * 4) = fVar40;
                    }
                    if (fVar2 < *(float *)((long)pvVar25 + (long)pMVar17 * 4)) {
                      *(float *)((long)pvVar25 + (long)pMVar17 * 4) = fVar2;
                    }
                    pMVar17 = (Mat *)((long)&pMVar17->data + 1);
                  } while (_size_3 != pMVar17);
                }
                break;
              case 0x167145:
                if (0 < iVar32) {
                  pMVar17 = (Mat *)0x0;
                  do {
                    local_1e0 = pMVar17;
                    fVar40 = expf((float)(*(uint *)((long)_remain + (long)pMVar17 * 4) ^
                                         auVar48._0_4_));
                    auVar45 = _DAT_001720f0;
                    auVar48 = _DAT_00171020;
                    auVar42 = _DAT_00171010;
                    *(float *)((long)_remain + (long)local_1e0 * 4) = 1.0 / (fVar40 + 1.0);
                    pMVar17 = (Mat *)((long)&local_1e0->data + 1);
                    auVar46 = local_d8;
                  } while (_size_3 != pMVar17);
                }
                break;
              case 0x1671cc:
                if (0 < iVar32) {
                  fVar40 = *local_e0;
                  pMVar17 = (Mat *)0x0;
                  do {
                    fVar2 = *(float *)((long)pvVar25 + (long)pMVar17 * 4);
                    uVar38 = -(uint)(0.0 < fVar2);
                    *(float *)((long)pvVar25 + (long)pMVar17 * 4) =
                         (float)(~uVar38 & (uint)fVar40 | uVar38 & 0x3f800000) * fVar2;
                    pMVar17 = (Mat *)((long)&pMVar17->data + 1);
                  } while (_size_3 != pMVar17);
                }
              }
            }
            uVar30 = local_128 + 1;
            lVar26 = local_160 + (long)local_178;
            local_1f8 = (void *)((long)local_1f8 + local_78);
            pvVar25 = (void *)((long)_remain + (long)local_178);
            uVar35 = local_168;
          } while (uVar30 != local_80);
        }
        local_140 = (Mat *)((long)&local_140->data + 1);
        local_e8 = (long)&local_a0->data + local_e8;
        local_138 = (ulong)(uint)((int)local_138 + local_10c);
        local_f0 = (void *)((long)local_f0 + (long)local_a0);
        pMVar17 = local_a0;
      } while (local_140 != local_98);
    }
  }
  pMVar29 = local_f8;
  opt_00 = local_100;
  uVar12 = local_1c8.elemsize._4_4_;
  uVar39 = (undefined4)local_1c8.elemsize;
  pDVar11 = local_208;
  auVar41._0_4_ = -(uint)(0 < local_208->pad_left);
  auVar41._4_4_ = -(uint)(0 < local_208->pad_right);
  auVar41._8_4_ = -(uint)(0 < local_208->pad_top);
  auVar41._12_4_ = -(uint)(0 < local_208->pad_bottom);
  iVar16 = movmskps((int)pMVar17,auVar41);
  local_1c8.elemsize._0_4_ = (undefined4)local_248.elemsize;
  local_1c8.elemsize._4_4_ = (undefined4)(local_248.elemsize >> 0x20);
  local_1c8.refcount = local_248.refcount;
  if (iVar16 == 0) {
    if ((local_208->output_w < 1) || (local_208->output_h < 1)) {
      local_1c8.elemsize._0_4_ = uVar39;
      local_1c8.elemsize._4_4_ = uVar12;
      if (local_208->output_pad_bottom < 1 && local_208->output_pad_right < 1) {
        Mat::operator=(local_f8,&local_248);
        piVar3 = (int *)CONCAT44(local_1c8.refcount._4_4_,local_1c8.refcount._0_4_);
      }
      else {
        copy_make_border(&local_248,local_f8,0,local_208->output_pad_bottom,0,
                         local_208->output_pad_right,0,0.0,local_100);
        piVar3 = (int *)CONCAT44(local_1c8.refcount._4_4_,local_1c8.refcount._0_4_);
        iVar32 = -100;
        local_1c8.refcount = (int *)CONCAT44(local_1c8.refcount._4_4_,local_1c8.refcount._0_4_);
        if ((pMVar29->data == (void *)0x0) ||
           (local_1c8.refcount = piVar3, (long)pMVar29->c * pMVar29->cstep == 0)) goto LAB_001676eb;
      }
    }
    else {
      local_1c8.data = local_248.data;
      local_1c8.elempack = local_248.elempack;
      local_1c8.allocator = local_248.allocator;
      local_1c8.w = local_248.w;
      local_1c8.dims = local_248.dims;
      local_1c8.c = local_248.c;
      local_1c8.h = local_248.h;
      local_1c8.cstep = local_248.cstep;
      if (local_248.refcount != (int *)0x0) {
        LOCK();
        *local_248.refcount = *local_248.refcount + 1;
        UNLOCK();
      }
      if (0 < local_208->output_pad_bottom || 0 < local_208->output_pad_right) {
        opt_b.use_int8_arithmetic = local_100->use_int8_arithmetic;
        opt_b.use_packing_layout = local_100->use_packing_layout;
        opt_b.use_shader_pack8 = local_100->use_shader_pack8;
        opt_b.use_bf16_storage = local_100->use_bf16_storage;
        opt_b._36_4_ = *(undefined4 *)&local_100->field_0x24;
        opt_b.lightmode = local_100->lightmode;
        opt_b._1_3_ = *(undefined3 *)&local_100->field_0x1;
        opt_b.num_threads = local_100->num_threads;
        opt_b.workspace_allocator = local_100->workspace_allocator;
        opt_b.use_winograd_convolution = local_100->use_winograd_convolution;
        opt_b.use_sgemm_convolution = local_100->use_sgemm_convolution;
        opt_b.use_int8_inference = local_100->use_int8_inference;
        opt_b.use_vulkan_compute = local_100->use_vulkan_compute;
        opt_b.use_fp16_packed = local_100->use_fp16_packed;
        opt_b.use_fp16_storage = local_100->use_fp16_storage;
        opt_b.use_fp16_arithmetic = local_100->use_fp16_arithmetic;
        opt_b.use_int8_storage = local_100->use_int8_storage;
        opt_b.blob_allocator = local_100->workspace_allocator;
        copy_make_border(&local_248,&local_1c8,0,local_208->output_pad_bottom,0,
                         local_208->output_pad_right,0,0.0,&opt_b);
        if ((local_1c8.data == (void *)0x0) || ((long)local_1c8.c * local_1c8.cstep == 0))
        goto LAB_0016765e;
      }
      iVar32 = local_1c8.w - pDVar11->output_w;
      iVar16 = local_1c8.h - pDVar11->output_h;
      if ((pDVar11->pad_left == -0xe9) ||
         (((pDVar11->pad_right == -0xe9 || (pDVar11->pad_top == -0xe9)) ||
          (pDVar11->pad_bottom == -0xe9)))) {
        iVar18 = iVar16 / 2;
        iVar14 = iVar16 - iVar18;
        iVar28 = iVar32 / 2;
        iVar16 = iVar32 - iVar28;
LAB_001675b3:
        copy_cut_border(&local_1c8,pMVar29,iVar18,iVar14,iVar28,iVar16,opt_00);
      }
      else if ((pDVar11->pad_top == -0xea ||
               (pDVar11->pad_right == -0xea || pDVar11->pad_left == -0xea)) ||
               pDVar11->pad_bottom == -0xea) {
        iVar14 = iVar16 / 2;
        iVar18 = iVar16 - iVar14;
        iVar16 = iVar32 / 2;
        iVar28 = iVar32 - iVar16;
        goto LAB_001675b3;
      }
      if (pMVar29->data == (void *)0x0) goto LAB_0016765e;
      iVar16 = pMVar29->c;
      sVar6 = pMVar29->cstep;
      Mat::~Mat(&local_1c8);
      piVar3 = local_1c8.refcount;
      if ((long)iVar16 * sVar6 == 0) goto LAB_0016766b;
    }
LAB_001676e8:
    iVar32 = 0;
    local_1c8.refcount = piVar3;
  }
  else {
    local_1c8.data = local_248.data;
    local_1c8.elempack = local_248.elempack;
    local_1c8.allocator = local_248.allocator;
    local_1c8.w = local_248.w;
    local_1c8.dims = local_248.dims;
    local_1c8.c = local_248.c;
    local_1c8.h = local_248.h;
    local_1c8.cstep = local_248.cstep;
    if (local_248.refcount != (int *)0x0) {
      LOCK();
      *local_248.refcount = *local_248.refcount + 1;
      UNLOCK();
    }
    if (local_208->output_pad_bottom < 1 && local_208->output_pad_right < 1) {
LAB_001673c6:
      copy_cut_border(&local_1c8,pMVar29,pDVar11->pad_top,pDVar11->pad_bottom,pDVar11->pad_left,
                      pDVar11->pad_right,opt_00);
      if (pMVar29->data == (void *)0x0) {
        bVar37 = false;
      }
      else {
        bVar37 = (long)pMVar29->c * pMVar29->cstep != 0;
      }
      if (local_1c8.refcount != (int *)0x0) {
        LOCK();
        *local_1c8.refcount = *local_1c8.refcount + -1;
        UNLOCK();
        if (*local_1c8.refcount == 0) {
          if (local_1c8.allocator == (Allocator *)0x0) {
            if (local_1c8.data != (void *)0x0) {
              free(local_1c8.data);
            }
          }
          else {
            (**(code **)(*(long *)local_1c8.allocator + 0x18))();
          }
        }
      }
      local_1c8.elemsize._0_4_ = 0;
      local_1c8.elemsize._4_4_ = 0;
      local_1c8.elempack = 0;
      local_1c8.data = (void *)0x0;
      local_1c8.dims = 0;
      local_1c8.w = 0;
      local_1c8.h = 0;
      local_1c8.c = 0;
      local_1c8.cstep = 0;
      iVar32 = -100;
      local_1c8.refcount = (int *)0x0;
      piVar3 = (int *)0x0;
      if (bVar37) goto LAB_001676e8;
    }
    else {
      opt_b.use_int8_arithmetic = local_100->use_int8_arithmetic;
      opt_b.use_packing_layout = local_100->use_packing_layout;
      opt_b.use_shader_pack8 = local_100->use_shader_pack8;
      opt_b.use_bf16_storage = local_100->use_bf16_storage;
      opt_b._36_4_ = *(undefined4 *)&local_100->field_0x24;
      opt_b.lightmode = local_100->lightmode;
      opt_b._1_3_ = *(undefined3 *)&local_100->field_0x1;
      opt_b.num_threads = local_100->num_threads;
      opt_b.workspace_allocator = local_100->workspace_allocator;
      opt_b.use_winograd_convolution = local_100->use_winograd_convolution;
      opt_b.use_sgemm_convolution = local_100->use_sgemm_convolution;
      opt_b.use_int8_inference = local_100->use_int8_inference;
      opt_b.use_vulkan_compute = local_100->use_vulkan_compute;
      opt_b.use_fp16_packed = local_100->use_fp16_packed;
      opt_b.use_fp16_storage = local_100->use_fp16_storage;
      opt_b.use_fp16_arithmetic = local_100->use_fp16_arithmetic;
      opt_b.use_int8_storage = local_100->use_int8_storage;
      opt_b.blob_allocator = local_100->workspace_allocator;
      copy_make_border(&local_248,&local_1c8,0,local_208->output_pad_bottom,0,
                       local_208->output_pad_right,0,0.0,&opt_b);
      if ((local_1c8.data != (void *)0x0) && ((long)local_1c8.c * local_1c8.cstep != 0))
      goto LAB_001673c6;
LAB_0016765e:
      Mat::~Mat(&local_1c8);
LAB_0016766b:
      iVar32 = -100;
    }
  }
LAB_001676eb:
  if (_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
LAB_00167708:
  if (local_248.refcount != (int *)0x0) {
    LOCK();
    *local_248.refcount = *local_248.refcount + -1;
    UNLOCK();
    if (*local_248.refcount == 0) {
      if (local_248.allocator == (Allocator *)0x0) {
        if (local_248.data != (void *)0x0) {
          free(local_248.data);
        }
      }
      else {
        (**(code **)(*(long *)local_248.allocator + 0x18))();
      }
    }
  }
  return iVar32;
}

Assistant:

int DeconvolutionDepthWise::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // deconvolv with NxN kernel
    // value = value + bias

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    if (channels % group != 0 || num_output % group != 0)
    {
        // reject invalid group
        return -100;
    }

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w;
    int outh = (h - 1) * stride_h + kernel_extent_h;

    Mat top_blob_bordered;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0 || output_pad_right > 0 || output_pad_bottom > 0 || (output_w > 0 && output_h > 0))
    {
        top_blob_bordered.create(outw, outh, num_output, elemsize, opt.workspace_allocator);
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, outh, num_output, elemsize, opt.blob_allocator);
    }
    if (top_blob_bordered.empty())
        return -100;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = outw * dilation_h - kernel_w * dilation_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2 += dilation_w;
            }
            p2 += gap;
        }
    }

    // depth-wise
    if (channels == group && group == num_output)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g=0; g<group; g++)
        {
            const float* inptr = bottom_blob.channel(g);
            const float* kptr = (const float*)weight_data + maxk * g;
            Mat m = top_blob_bordered.channel(g);

            const float bias = bias_term ? bias_data[g] : 0.f;

            m.fill(bias);

            for (int i = 0; i < h; i++)
            {
                for (int j = 0; j < w; j++)
                {
                    float* outptr = m.row(i*stride_h) + j*stride_w;

                    for (int k = 0; k < maxk; k++)
                    {
                        float val = inptr[i*w + j];
                        float w = kptr[k];
                        outptr[ space_ofs[k] ] += val * w;
                    }
                }
            }


            if (activation_type == 1)
            {
                float* outptr = m;
                int size = outw * outh;

                for (int i = 0; i < size; i++)
                {
                    outptr[i] = std::max(outptr[i], 0.f);
                }
            }
            else if (activation_type == 2)
            {
                float* outptr = m;
                int size = outw * outh;
                float slope = activation_params[0];

                for (int i = 0; i < size; i++)
                {
                    outptr[i] = outptr[i] > 0.f ? outptr[i] : outptr[i] * slope;
                }
            }
            else if (activation_type == 3)
            {
                float* outptr = m;
                int size = outw * outh;
                float min = activation_params[0];
                float max = activation_params[1];

                for (int i = 0; i < size; i++)
                {
                    if (outptr[i] < min)
                        outptr[i] = min;
                    if (outptr[i] > max)
                        outptr[i] = max;
                }
            }
            else if (activation_type == 4)
            {
                float* outptr = m;
                int size = outw * outh;

                for (int i = 0; i < size; i++)
                {
                    outptr[i] = static_cast<float>(1.f / (1.f + exp(-outptr[i])));
                }
            }
        }
    }
    else
    {
        // num_output
        const int channels_g = channels / group;
        const int num_output_g = num_output / group;

#ifdef _WIN32
        #pragma omp parallel for num_threads(opt.num_threads)
#else // _WIN32
        #pragma omp parallel for collapse(2) num_threads(opt.num_threads)
#endif // _WIN32
        for (int g = 0; g < group; g++)
        {
            for (int p = 0; p < num_output_g; p++)
            {
                Mat out = top_blob_bordered.channel(g * num_output_g + p);

                const float* weight_data_ptr = (const float*)weight_data + maxk * channels_g * num_output_g * g;
                const float bias = bias_term ? bias_data[g * num_output_g + p] : 0.f;

                out.fill(bias);

                for (int i = 0; i < h; i++)
                {
                    for (int j = 0; j < w; j++)
                    {
                        float* outptr = out.row(i*stride_h) + j*stride_w;

                        const float* kptr = weight_data_ptr + maxk * channels_g * p;

                        // channels_g
                        for (int q = 0; q < channels_g; q++)
                        {
                            const Mat m = bottom_blob.channel(channels_g * g + q);
                            float val = *(m.row(i) + j);

                            for (int k = 0; k < maxk; k++)
                            {
                                outptr[ space_ofs[k] ] += val * kptr[k];
                            }

                            kptr += maxk;
                        }
                    }
                }

                if (activation_type == 1)
                {
                    float* outptr = out;
                    int size = outw * outh;

                    for (int i = 0; i < size; i++)
                    {
                        outptr[i] = std::max(outptr[i], 0.f);
                    }
                }
                else if (activation_type == 2)
                {
                    float* outptr = out;
                    int size = outw * outh;
                    float slope = activation_params[0];

                    for (int i = 0; i < size; i++)
                    {
                        outptr[i] = outptr[i] > 0.f ? outptr[i] : outptr[i] * slope;
                    }
                }
                else if (activation_type == 3)
                {
                    float* outptr = out;
                    int size = outw * outh;
                    float min = activation_params[0];
                    float max = activation_params[1];

                    for (int i = 0; i < size; i++)
                    {
                        if (outptr[i] < min)
                            outptr[i] = min;
                        if (outptr[i] > max)
                            outptr[i] = max;
                    }
                }
                else if (activation_type == 4)
                {
                    float* outptr = out;
                    int size = outw * outh;

                    for (int i = 0; i < size; i++)
                    {
                        outptr[i] = static_cast<float>(1.f / (1.f + exp(-outptr[i])));
                    }
                }
            }
        }
    }

    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0)
    {
        Mat top_blob_bordered_adj = top_blob_bordered;
        if (output_pad_right > 0 || output_pad_bottom > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(top_blob_bordered, top_blob_bordered_adj, 0, output_pad_bottom, 0, output_pad_right, BORDER_CONSTANT, 0.f, opt_b);
            if (top_blob_bordered_adj.empty())
                return -100;
        }

        copy_cut_border(top_blob_bordered_adj, top_blob, pad_top, pad_bottom, pad_left, pad_right, opt);
        if (top_blob.empty())
            return -100;

        outw = top_blob.w;
        outh = top_blob.h;
    }
    else if (output_w > 0 && output_h > 0)
    {
        Mat top_blob_bordered_adj = top_blob_bordered;
        if (output_pad_right > 0 || output_pad_bottom > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(top_blob_bordered, top_blob_bordered_adj, 0, output_pad_bottom, 0, output_pad_right, BORDER_CONSTANT, 0.f, opt_b);
            if (top_blob_bordered_adj.empty())
                return -100;
        }

        int wcut = top_blob_bordered_adj.w - output_w;
        int hcut = top_blob_bordered_adj.h - output_h;

        if (pad_left == -233 || pad_right == -233 || pad_top == -233 || pad_bottom == -233)
        {
            // onnx padding=SAME_UPPER
            copy_cut_border(top_blob_bordered_adj, top_blob, hcut / 2, hcut - hcut / 2, wcut / 2, wcut - wcut / 2, opt);
        }
        else if (pad_left == -234 || pad_right == -234 || pad_top == -234 || pad_bottom == -234)
        {
            // onnx padding=SAME_LOWER
            copy_cut_border(top_blob_bordered_adj, top_blob, hcut - hcut / 2, hcut / 2, wcut - wcut / 2, wcut / 2, opt);
        }
        if (top_blob.empty())
            return -100;

        outw = top_blob.w;
        outh = top_blob.h;
    }
    else
    {
        if (output_pad_right > 0 || output_pad_bottom > 0)
        {
            copy_make_border(top_blob_bordered, top_blob, 0, output_pad_bottom, 0, output_pad_right, BORDER_CONSTANT, 0.f, opt);
            if (top_blob.empty())
                return -100;
        }
        else
        {
            top_blob = top_blob_bordered;
        }
    }

    return 0;
}